

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Implicit_manifold_intersection_oracle.h
# Opt level: O1

VectorXd __thiscall
Gudhi::coxeter_triangulation::
Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Constant_function>
::
compute_lambda<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Constant_function>
           *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *simplex,
          Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *triangulation)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  const_iterator cVar4;
  undefined8 *puVar5;
  Vertex_handle *in_RCX;
  double *pdVar6;
  char *__function;
  DenseStorage<double,__1,__1,_1,_0> *pDVar7;
  long lVar8;
  Index extraout_RDX;
  pointer piVar9;
  long lVar10;
  long lVar11;
  ActualDstType actualDst;
  DenseStorage<double,__1,__1,_1,_0> *pDVar12;
  bool bVar13;
  VectorXd VVar14;
  MatrixXd matrix;
  VectorXd z;
  VectorXd *lambda;
  VectorXd v_coords;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0;
  DenseStorage<double,__1,__1,__1,_0> local_1b8;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_198;
  pointer local_160;
  DenseStorage<double,__1,__1,_1,_0> *local_158;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_150;
  Vertex_handle *local_148;
  undefined1 local_140 [16];
  vector<int,_std::allocator<int>_> local_130;
  SrcXprType local_118;
  vector<int,_std::allocator<int>_> local_108;
  byte local_f0;
  void *local_e0;
  undefined1 local_d0 [48];
  const_iterator local_a0;
  const_iterator cStack_98;
  vector<int,_std::allocator<int>_> local_90;
  bool local_78;
  undefined7 uStack_77;
  double *local_68;
  
  piVar1 = (simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pDVar12 = (DenseStorage<double,__1,__1,_1,_0> *)((long)piVar1 + 1);
  local_1b8.m_data = (double *)0x0;
  local_1b8.m_rows = 0;
  local_1b8.m_cols = 0;
  local_158 = (DenseStorage<double,__1,__1,_1,_0> *)this;
  local_150 = simplex;
  if ((long)pDVar12 < 0) {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  else {
    if ((pDVar12 != (DenseStorage<double,__1,__1,_1,_0> *)0x0) &&
       (auVar2._8_8_ = 0, auVar2._0_8_ = pDVar12,
       auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / auVar2,0) < (long)pDVar12)) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8,simplex,SUB168(auVar3 % auVar2,0));
      *puVar5 = operator_delete;
      __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_148 = in_RCX;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_1b8,(long)pDVar12 * (long)pDVar12,(Index)pDVar12,(Index)pDVar12);
    if (pDVar12 != (DenseStorage<double,__1,__1,_1,_0> *)0x0) {
      if (local_1b8.m_rows < 1) {
LAB_001202ae:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pDVar7 = (DenseStorage<double,__1,__1,_1,_0> *)0x0;
      pdVar6 = local_1b8.m_data;
      do {
        if (local_1b8.m_cols <= (long)pDVar7) goto LAB_001202ae;
        *pdVar6 = 1.0;
        pDVar7 = (DenseStorage<double,__1,__1,_1,_0> *)((long)&pDVar7->m_data + 1);
        pdVar6 = pdVar6 + local_1b8.m_rows;
      } while (pDVar12 != pDVar7);
    }
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::vertex_range((Vertex_range *)local_d0,
                   (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)triangulation);
    local_198.o_it_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._0_8_;
    local_198.o_end_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._8_8_;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_198.value_,(vector<int,_std::allocator<int>_> *)(local_d0 + 0x10));
    local_198.is_end_ = local_d0[0x28];
    local_118.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a0._M_current;
    local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)cStack_98._M_current;
    local_160 = piVar1;
    std::vector<int,_std::allocator<int>_>::vector(&local_108,&local_90);
    piVar1 = local_160;
    local_f0 = local_78;
    if ((local_198.is_end_ & local_78) == 0) {
      lVar10 = 0;
      lVar11 = 0;
      do {
        std::vector<int,_std::allocator<int>_>::vector(&local_130,&local_198.value_);
        Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::cartesian_coordinates
                  ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)&local_e0,local_148,1.0);
        Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)local_140,(VectorXd *)local_150);
        free(local_e0);
        if ((DenseStorage<double,__1,__1,_1,_0> *)0x1 < pDVar12) {
          piVar9 = (pointer)0x1;
          do {
            if ((long)local_140._8_8_ < (long)piVar9) goto LAB_001202cd;
            if (((lVar11 < 0) || (local_1b8.m_rows <= (long)piVar9)) || (local_1b8.m_cols <= lVar11)
               ) goto LAB_001202ae;
            *(undefined8 *)((long)local_1b8.m_data + (long)piVar9 * 8 + local_1b8.m_rows * lVar10) =
                 *(undefined8 *)(local_140._0_8_ + (long)piVar9 * 8 + -8);
            bVar13 = piVar9 != piVar1;
            piVar9 = (pointer)((long)piVar9 + 1);
          } while (bVar13);
        }
        free((void *)local_140._0_8_);
        if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_198.is_end_ == false) {
          Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::update_value(&local_198);
          local_198.o_it_._M_current = local_198.o_it_._M_current + 1;
          if (local_198.o_it_._M_current == local_198.o_end_._M_current) {
            local_198.is_end_ = true;
          }
        }
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 8;
      } while ((local_198.is_end_ != true) || ((local_f0 & 1) == 0));
    }
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar1 = local_160;
    if (local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)local_d0._16_8_ != (double *)0x0) {
      operator_delete((void *)local_d0._16_8_,local_d0._32_8_ - local_d0._16_8_);
    }
    local_198.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_198.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    cVar4._M_current = local_198.o_it_._M_current;
    if (pDVar12 != (DenseStorage<double,__1,__1,_1,_0> *)0x0) {
      free((void *)0x0);
      if (pDVar12 == (DenseStorage<double,__1,__1,_1,_0> *)0x0) {
        local_198.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        cVar4._M_current = local_198.o_it_._M_current;
      }
      else {
        if ((ulong)pDVar12 >> 0x3d != 0) {
LAB_0012036f:
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = operator_delete;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        cVar4._M_current =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)malloc((long)pDVar12 * 8);
        if ((piVar1 != (pointer)0x0) && (((ulong)cVar4._M_current & 0xf) != 0)) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if ((DenseStorage<double,__1,__1,_1,_0> *)cVar4._M_current ==
            (DenseStorage<double,__1,__1,_1,_0> *)0x0) goto LAB_0012036f;
      }
    }
    local_198.o_it_._M_current = cVar4._M_current;
    local_198.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)pDVar12;
    if (pDVar12 == (DenseStorage<double,__1,__1,_1,_0> *)0x0) {
LAB_001202cd:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    ((local_198.o_it_._M_current)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
    if (piVar1 != (pointer)0x0) {
      memset(&((local_198.o_it_._M_current)->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish,0,(long)piVar1 << 3);
    }
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1b8);
    Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
    _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
               local_d0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_198);
    pDVar12 = local_158;
    local_158->m_data = (double *)0x0;
    local_158->m_rows = 0;
    local_118.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d0;
    local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)&local_198;
    if (-1 < (long)local_d0._16_8_) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(local_158,local_d0._16_8_,local_d0._16_8_,1)
      ;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,_1,_0,__1,_1> *)pDVar12,&local_118,
            (assign_op<double,_double> *)&local_130);
      free(local_68);
      free((void *)CONCAT71(uStack_77,local_78));
      free(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish);
      free(cStack_98._M_current);
      free((void *)CONCAT71(local_d0._41_7_,local_d0[0x28]));
      free((void *)local_d0._24_8_);
      free((void *)local_d0._0_8_);
      if (local_1b8.m_cols != pDVar12->m_rows) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_d0._8_8_ = pDVar12;
      local_118.m_dec =
           (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3d719799812dea11;
      local_d0._0_8_ = &local_1b8;
      bVar13 = Eigen::internal::
               isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
               ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_198,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)local_d0,(RealScalar *)&local_118);
      if ((!bVar13) && (lVar10 = pDVar12->m_rows, lVar10 != 0)) {
        pdVar6 = pDVar12->m_data;
        lVar8 = 0;
        lVar11 = 0;
        if (0 < lVar10) {
          lVar11 = lVar10;
        }
        do {
          if (lVar11 == lVar8) goto LAB_001202cd;
          pdVar6[lVar8] = NAN;
          lVar8 = lVar8 + 1;
        } while (lVar10 != lVar8);
      }
      free(local_198.o_it_._M_current);
      free(local_1b8.m_data);
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)pDVar12;
      return (VectorXd)
             VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

Eigen::VectorXd compute_lambda(const Simplex_handle& simplex, const Triangulation& triangulation) const {
    std::size_t cod_d = this->cod_d();
    Eigen::MatrixXd matrix(cod_d + 1, cod_d + 1);
    for (std::size_t i = 0; i < cod_d + 1; ++i) matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : simplex.vertex_range()) {
      Eigen::VectorXd v_coords = fun_(triangulation.cartesian_coordinates(v));
      for (std::size_t i = 1; i < cod_d + 1; ++i) matrix(i, j) = v_coords(i - 1);
      j++;
    }
    Eigen::VectorXd z(cod_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < cod_d + 1; ++i) z(i) = 0;
    Eigen::VectorXd lambda = matrix.colPivHouseholderQr().solve(z);
    if (!z.isApprox(matrix*lambda)) {
      // NaN non valid results
      for (std::size_t i = 0; i < (std::size_t)lambda.size(); ++i) lambda(i) =
        std::numeric_limits<double>::quiet_NaN();
    }
    return lambda;
  }